

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O0

int ICM::Parser::convertChar(char c)

{
  int iVar1;
  bool bVar2;
  int local_c;
  char c_local;
  
  iVar1 = isdigit((int)c);
  bVar2 = true;
  if (iVar1 == 0) {
    iVar1 = isalpha((int)c);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    __assert_fail("isdigit(c) || isalpha(c)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/parser/parsenumber.cpp"
                  ,0x1e,"int ICM::Parser::convertChar(char)");
  }
  if ((c < '0') || ('9' < c)) {
    if ((c < 'A') || ('Z' < c)) {
      local_c = c + -0x57;
    }
    else {
      local_c = c + -0x37;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

static int convertChar(char c)
		{
			assert(isdigit(c) || isalpha(c));

			if (c >= '0' && c <= '9')
				return c - '0';
			else if (c >= 'A' && c <= 'Z')
				return c - 'A' + 10;
			else
				return c - 'a' + 10;
		}